

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTransformFeedbackTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::TransformFeedback::Varying::Varying
          (Varying *this,char *name_,VarType *type_,Interpolation interp_)

{
  allocator<char> local_25;
  Interpolation local_24;
  VarType *pVStack_20;
  Interpolation interp__local;
  VarType *type__local;
  char *name__local;
  Varying *this_local;
  
  local_24 = interp_;
  pVStack_20 = type_;
  type__local = (VarType *)name_;
  name__local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)this,name_,&local_25);
  std::allocator<char>::~allocator(&local_25);
  glu::VarType::VarType(&this->type,pVStack_20);
  this->interpolation = local_24;
  return;
}

Assistant:

Varying				(const char* name_, const glu::VarType& type_, Interpolation interp_)
							: name			(name_)
							, type			(type_)
							, interpolation	(interp_)
						{
						}